

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

void __thiscall llm_graph_input_cls::set_input(llm_graph_input_cls *this,llama_ubatch *ubatch)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  char cVar6;
  long lVar7;
  ulong uVar8;
  llama_cparams *plVar9;
  byte bVar10;
  int i;
  char *pcVar11;
  ulong uVar12;
  undefined8 uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  vector<int,_std::allocator<int>_> last_row;
  vector<int,_std::allocator<int>_> last_pos;
  allocator_type local_6d;
  value_type_conflict3 local_6c;
  llm_graph_input_cls *local_68;
  _Vector_base<int,_std::allocator<int>_> local_60;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  plVar9 = this->cparams;
  bVar10 = plVar9->embeddings;
  if (((bool)bVar10 == true) &&
     ((plVar9->pooling_type == LLAMA_POOLING_TYPE_RANK ||
      (plVar9->pooling_type == LLAMA_POOLING_TYPE_CLS)))) {
    if (this->cls == (ggml_tensor *)0x0) {
      pcVar11 = "cls";
      uVar13 = 0xca;
      goto LAB_001eaef9;
    }
    uVar1 = ubatch->n_tokens;
    uVar2 = ubatch->n_seq_tokens;
    uVar3 = ubatch->n_seqs;
    cVar6 = ggml_backend_buffer_is_host(this->cls->buffer);
    if (cVar6 == '\0') {
      pcVar11 = "ggml_backend_buffer_is_host(cls->buffer)";
      uVar13 = 0xcb;
      goto LAB_001eaef9;
    }
    pvVar5 = this->cls->data;
    local_68 = this;
    lVar7 = ggml_element_size();
    lVar16 = 0;
    memset(pvVar5,0,lVar7 * (ulong)uVar1);
    for (uVar8 = 0; uVar8 != uVar3; uVar8 = uVar8 + 1) {
      iVar4 = *ubatch->seq_id[uVar8];
      lVar7 = lVar16;
      uVar12 = (ulong)uVar2;
      if ((long)(ulong)uVar1 <= (long)iVar4) {
        pcVar11 = 
        "seq_id < n_tokens && \"seq_id cannot be larger than n_tokens with pooling_type == CLS or RANK\""
        ;
        uVar13 = 0xd4;
        goto LAB_001eaef9;
      }
      while (bVar17 = uVar12 != 0, uVar12 = uVar12 - 1, bVar17) {
        if (ubatch->pos[lVar7] == 0) {
          *(int *)((long)pvVar5 + (long)iVar4 * 4) = (int)lVar7;
        }
        lVar7 = lVar7 + 1;
      }
      lVar16 = lVar16 + (ulong)uVar2;
    }
    plVar9 = local_68->cparams;
    bVar10 = plVar9->embeddings;
    this = local_68;
  }
  if (((bVar10 & 1) == 0) || (plVar9->pooling_type != LLAMA_POOLING_TYPE_LAST)) {
    return;
  }
  if (this->cls == (ggml_tensor *)0x0) {
    pcVar11 = "cls";
    uVar13 = 0xe5;
  }
  else {
    uVar8 = (ulong)ubatch->n_tokens;
    uVar1 = ubatch->n_seq_tokens;
    uVar2 = ubatch->n_seqs;
    cVar6 = ggml_backend_buffer_is_host(this->cls->buffer);
    if (cVar6 != '\0') {
      pvVar5 = this->cls->data;
      lVar7 = ggml_element_size();
      memset(pvVar5,0,lVar7 * uVar8);
      local_60._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_48,uVar8,
                 (value_type_conflict3 *)&local_60,(allocator_type *)&local_6c);
      local_6c = -1;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_60,uVar8,&local_6c,&local_6d);
      lVar7 = 0;
      uVar12 = 0;
      while( true ) {
        if (uVar12 == uVar2) {
          for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
            iVar4 = *(int *)(CONCAT44(local_60._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      local_60._M_impl.super__Vector_impl_data._M_start._0_4_) +
                            uVar12 * 4);
            if (-1 < iVar4) {
              *(int *)((long)pvVar5 + uVar12 * 4) = iVar4;
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
          return;
        }
        lVar16 = (long)*ubatch->seq_id[uVar12];
        if ((long)uVar8 <= lVar16) break;
        lVar14 = lVar7;
        uVar15 = (ulong)uVar1;
        while (bVar17 = uVar15 != 0, uVar15 = uVar15 - 1, bVar17) {
          if (local_48._M_impl.super__Vector_impl_data._M_start[lVar16] <= ubatch->pos[lVar14]) {
            local_48._M_impl.super__Vector_impl_data._M_start[lVar16] = ubatch->pos[lVar14];
            *(int *)(CONCAT44(local_60._M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_60._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar16 * 4)
                 = (int)lVar14;
          }
          lVar14 = lVar14 + 1;
        }
        uVar12 = uVar12 + 1;
        lVar7 = lVar7 + (ulong)uVar1;
      }
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0xf2,"GGML_ASSERT(%s) failed",
                 "seq_id < n_tokens && \"seq_id cannot be larger than n_tokens with pooling_type == LAST\""
                );
    }
    pcVar11 = "ggml_backend_buffer_is_host(cls->buffer)";
    uVar13 = 0xe6;
  }
LAB_001eaef9:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
             ,uVar13,"GGML_ASSERT(%s) failed",pcVar11);
}

Assistant:

void llm_graph_input_cls::set_input(const llama_ubatch * ubatch) {
    if (cparams.embeddings && (
                cparams.pooling_type == LLAMA_POOLING_TYPE_CLS ||
                cparams.pooling_type == LLAMA_POOLING_TYPE_RANK)) {
        const int64_t n_tokens     = ubatch->n_tokens;
        const int64_t n_seq_tokens = ubatch->n_seq_tokens;
        const int64_t n_seqs       = ubatch->n_seqs;

        GGML_ASSERT(cls);
        GGML_ASSERT(ggml_backend_buffer_is_host(cls->buffer));

        uint32_t * data = (uint32_t *) cls->data;
        memset(cls->data, 0, n_tokens * ggml_element_size(cls));

        for (int s = 0; s < n_seqs; ++s) {
            const llama_seq_id seq_id = ubatch->seq_id[s][0];

            // TODO: adapt limits to n_seqs when ubatch->equal_seqs is true
            GGML_ASSERT(seq_id < n_tokens && "seq_id cannot be larger than n_tokens with pooling_type == CLS or RANK");

            for (int i = 0; i < n_seq_tokens; ++i) {
                const llama_pos pos = ubatch->pos[s*n_seq_tokens + i];

                if (pos == 0) {
                    data[seq_id] = s*n_seq_tokens + i;
                }
            }
        }
    }

    if (cparams.embeddings && cparams.pooling_type == LLAMA_POOLING_TYPE_LAST) {
        const int64_t n_tokens     = ubatch->n_tokens;
        const int64_t n_seq_tokens = ubatch->n_seq_tokens;
        const int64_t n_seqs       = ubatch->n_seqs;

        GGML_ASSERT(cls);
        GGML_ASSERT(ggml_backend_buffer_is_host(cls->buffer));

        uint32_t * data = (uint32_t *) cls->data;
        memset(cls->data, 0, n_tokens * ggml_element_size(cls));

        std::vector<int> last_pos(n_tokens, -1);
        std::vector<int> last_row(n_tokens, -1);

        for (int s = 0; s < n_seqs; ++s) {
            const llama_seq_id seq_id = ubatch->seq_id[s][0];

            // TODO: adapt limits to n_seqs when ubatch->equal_seqs is true
            GGML_ASSERT(seq_id < n_tokens && "seq_id cannot be larger than n_tokens with pooling_type == LAST");

            for (int i = 0; i < n_seq_tokens; ++i) {
                const llama_pos pos = ubatch->pos[s*n_seq_tokens + i];

                if (pos >= last_pos[seq_id]) {
                    last_pos[seq_id] = pos;
                    last_row[seq_id] = s*n_seq_tokens + i;
                }
            }
        }

        for (int i = 0; i < n_tokens; ++i) {
            if (last_row[i] >= 0) {
                data[i] = last_row[i];
            }
        }
    }
}